

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

string * __thiscall libcellml::Entity::id_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  string *psVar1;
  Entity *this_local;
  
  psVar1 = (string *)pFunc(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Entity::id() const
{
    return pFunc()->mId;
}